

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void __thiscall
discordpp::
field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
::field(field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
        *this,field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
              *f)

{
  if ((f->t_)._M_t.
      super___uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_false>
      ._M_head_impl ==
      (map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
       *)0x0) {
    (this->t_)._M_t.
    super___uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
    .
    super__Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_false>
    ._M_head_impl =
         (map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
          *)0x0;
  }
  else {
    std::
    make_unique<std::map<discordpp::Snowflake,discordpp::User,std::less<discordpp::Snowflake>,std::allocator<std::pair<discordpp::Snowflake_const,discordpp::User>>>,std::map<discordpp::Snowflake,discordpp::User,std::less<discordpp::Snowflake>,std::allocator<std::pair<discordpp::Snowflake_const,discordpp::User>>>&>
              ((map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
                *)this);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}